

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O3

void __thiscall
QMdiAreaPrivate::updateActiveWindow(QMdiAreaPrivate *this,int removedIndex,bool activeRemoved)

{
  QWidget *this_00;
  pointer piVar1;
  QMdiSubWindow *child;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  
  if ((this->indicesToActivatedChildren).d.size != 0) {
    uVar3 = 0;
    do {
      piVar1 = QList<int>::data(&this->indicesToActivatedChildren);
      if (removedIndex < piVar1[uVar3]) {
        piVar1[uVar3] = piVar1[uVar3] + -1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)(this->indicesToActivatedChildren).d.size);
  }
  if (-1 < removedIndex && this->tabBar != (QMdiAreaTabBar *)0x0) {
    bVar2 = SUB81(this->tabBar,0);
    QObject::blockSignals(bVar2);
    QTabBar::removeTab(&this->tabBar->super_QTabBar,removedIndex);
    updateTabBarGeometry(this);
    QObject::blockSignals(bVar2);
  }
  if ((this->childWindows).d.size == 0) {
    this->showActiveWindowMaximized = false;
    resetActiveWindow(this,(QMdiSubWindow *)0x0);
    return;
  }
  iVar4 = this->indexToHighlighted;
  if (-1 < iVar4) {
    if (iVar4 == removedIndex) {
      this_00 = &this->rubberBand->super_QWidget;
      iVar4 = -1;
      if ((this_00 != (QWidget *)0x0) && ((this_00->data->widget_attributes & 0x8000) != 0)) {
        QWidget::hide(this_00);
      }
    }
    else {
      if (iVar4 <= removedIndex) goto LAB_00441519;
      iVar4 = iVar4 + -1;
    }
    this->indexToHighlighted = iVar4;
  }
LAB_00441519:
  if (activeRemoved) {
    child = nextVisibleSubWindow(this,0,this->activationOrder,removedIndex,-1);
    if (child != (QMdiSubWindow *)0x0) {
      activateWindow(this,child);
      return;
    }
  }
  return;
}

Assistant:

void QMdiAreaPrivate::updateActiveWindow(int removedIndex, bool activeRemoved)
{
    Q_ASSERT(indicesToActivatedChildren.size() == childWindows.size());

    // Update indices list first so that we don't rely
    for (int i = 0; i < indicesToActivatedChildren.size(); ++i) {
        int &index = indicesToActivatedChildren[i];
        if (index > removedIndex)
            --index;
    }

#if QT_CONFIG(tabbar)
    if (tabBar && removedIndex >= 0) {
        const QSignalBlocker blocker(tabBar);
        tabBar->removeTab(removedIndex);
        updateTabBarGeometry();
    }
#endif

    if (childWindows.isEmpty()) {
        showActiveWindowMaximized = false;
        resetActiveWindow();
        return;
    }

    if (indexToHighlighted >= 0) {
#if QT_CONFIG(rubberband)
        // Hide rubber band if highlighted window is removed.
        if (indexToHighlighted == removedIndex)
            hideRubberBand();
        else
#endif
        // or update index if necessary.
        if (indexToHighlighted > removedIndex)
            --indexToHighlighted;
    }

    if (!activeRemoved)
        return;

    // Activate next window.
    QMdiSubWindow *next = nextVisibleSubWindow(0, activationOrder, removedIndex);
    if (next)
        activateWindow(next);
}